

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetMemUsage(Wln_Ret_t *p)

{
  return ((p->vFanouts).nCap + (p->vFanins).nCap + (p->vEdgeLinks).nCap + (p->vFfClasses).nCap +
          (p->vNodeDelays).nCap + (p->vPathDelays).nCap + (p->vSources).nCap + (p->vSinks).nCap +
          (p->vFront).nCap + (p->vMoves).nCap) * 4 + 0xb0;
}

Assistant:

int Wln_RetMemUsage( Wln_Ret_t * p )
{
    int Mem = sizeof(Wln_Ret_t);
    Mem += 4 * p->vFanins.nCap;
    Mem += 4 * p->vFanouts.nCap;
    Mem += 4 * p->vEdgeLinks.nCap;
    Mem += 4 * p->vFfClasses.nCap;
    Mem += 4 * p->vNodeDelays.nCap;
    Mem += 4 * p->vPathDelays.nCap;
    Mem += 4 * p->vSources.nCap;
    Mem += 4 * p->vSinks.nCap;
    Mem += 4 * p->vFront.nCap;
    Mem += 4 * p->vMoves.nCap;
    return Mem;
}